

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

longlong ImGui::ScaleValueFromRatioT<long_long,long_long,double>
                   (ImGuiDataType data_type,float t,longlong v_min,longlong v_max,
                   bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  longlong lVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float local_94;
  double local_90;
  float local_84;
  double local_80;
  float local_78;
  bool local_71;
  double v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  double v_max_fudged;
  double v_min_fudged;
  longlong lStack_40;
  bool flipped;
  longlong result;
  float fStack_30;
  bool is_decimal;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  longlong v_max_local;
  longlong v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    _t_local = 0;
  }
  else {
    local_71 = data_type == 8 || data_type == 9;
    result._3_1_ = local_71;
    result._4_4_ = zero_deadzone_halfsize;
    fStack_30 = logarithmic_zero_epsilon;
    zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local._0_4_ = t;
    v_min_local._4_4_ = data_type;
    if (is_logarithmic) {
      lStack_40 = v_min;
      if ((0.0 < t) && (lStack_40 = v_max, t < 1.0)) {
        v_min_fudged._7_1_ = v_max < v_min;
        dVar4 = ImAbs((double)v_min);
        if ((double)fStack_30 <= dVar4) {
          local_80 = (double)v_max_local;
        }
        else {
          if (0.0 <= (float)v_max_local) {
            local_78 = fStack_30;
          }
          else {
            local_78 = -fStack_30;
          }
          local_80 = (double)local_78;
        }
        v_max_fudged = local_80;
        dVar4 = ImAbs((double)_logarithmic_zero_epsilon_local);
        if ((double)fStack_30 <= dVar4) {
          local_90 = (double)_logarithmic_zero_epsilon_local;
        }
        else {
          if (0.0 <= (float)_logarithmic_zero_epsilon_local) {
            local_84 = fStack_30;
          }
          else {
            local_84 = -fStack_30;
          }
          local_90 = (double)local_84;
        }
        _zero_point_center = local_90;
        if ((v_min_fudged._7_1_ & 1) != 0) {
          ImSwap<double>(&v_max_fudged,(double *)&zero_point_center);
        }
        dVar4 = v_max_fudged;
        if ((((float)_logarithmic_zero_epsilon_local == 0.0) &&
            (!NAN((float)_logarithmic_zero_epsilon_local))) && ((float)v_max_local < 0.0)) {
          _zero_point_center = (double)-fStack_30;
        }
        if ((v_min_fudged._7_1_ & 1) == 0) {
          local_94 = (float)v_min_local;
        }
        else {
          local_94 = 1.0 - (float)v_min_local;
        }
        if (0.0 <= (float)(v_max_local * _logarithmic_zero_epsilon_local)) {
          if (((float)v_max_local < 0.0) || ((float)_logarithmic_zero_epsilon_local < 0.0)) {
            dVar4 = -_zero_point_center;
            dVar5 = ImPow(-v_max_fudged / -_zero_point_center,(double)(1.0 - local_94));
            dVar4 = -(dVar4 * dVar5);
          }
          else {
            dVar5 = ImPow(_zero_point_center / v_max_fudged,(double)local_94);
            dVar4 = dVar4 * dVar5;
          }
          lStack_40 = (longlong)dVar4;
        }
        else {
          lVar1 = ImMin<long_long>(v_max_local,_logarithmic_zero_epsilon_local);
          fVar2 = ImAbs((float)_logarithmic_zero_epsilon_local - (float)v_max_local);
          fVar2 = -(float)lVar1 / fVar2;
          fVar3 = fVar2 + result._4_4_;
          if ((local_94 < fVar2 - result._4_4_) || (fVar3 < local_94)) {
            if (fVar2 <= local_94) {
              dVar4 = (double)fStack_30;
              dVar5 = ImPow(_zero_point_center / (double)fStack_30,
                            (double)((local_94 - fVar3) / (1.0 - fVar3)));
              dVar4 = dVar4 * dVar5;
            }
            else {
              dVar4 = (double)fStack_30;
              dVar5 = ImPow(-v_max_fudged / (double)fStack_30,
                            (double)(1.0 - local_94 / (fVar2 - result._4_4_)));
              dVar4 = -(dVar4 * dVar5);
            }
            lStack_40 = (longlong)dVar4;
          }
          else {
            lStack_40 = 0;
          }
        }
      }
    }
    else if (data_type == 8 || data_type == 9) {
      lStack_40 = ImLerp<long_long>(v_min,v_max,t);
    }
    else {
      lStack_40 = v_max;
      if (t < 1.0) {
        fVar2 = -0.5;
        if (v_min <= v_max) {
          fVar2 = 0.5;
        }
        lStack_40 = v_min + (long)((float)(v_max - v_min) * t + fVar2);
      }
    }
    _t_local = lStack_40;
  }
  return _t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return (TYPE)0.0f;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}